

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

void amrex::MLLinOp::makeConsolidatedDMap
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *ba,
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dm,
               int ratio,int strategy)

{
  uint uVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pDVar4;
  long *plVar5;
  int *piVar6;
  pointer piVar7;
  Vector<int,_std::allocator<int>_> *pVVar8;
  div_t dVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int *x_1;
  pointer piVar13;
  double dVar14;
  int local_88;
  allocator_type local_81;
  Vector<int,_std::allocator<int>_> pmap;
  Vector<int,_std::allocator<int>_> pmap_g;
  
  pBVar2 = (ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar3 = (ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_88 = 1;
  for (lVar12 = 1; lVar12 < (int)(((long)pBVar2 - (long)pBVar3) / 0x68); lVar12 = lVar12 + 1) {
    pDVar4 = (dm->
             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>).
             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar5 = *(long **)&pDVar4[lVar12].m_ref.
                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ;
    if (*plVar5 == plVar5[1]) {
      local_88 = local_88 * ratio;
      uVar1 = *(uint *)(DAT_006e0650 + -0x38);
      pVVar8 = DistributionMapping::ProcessorMap(pDVar4 + lVar12 + -1);
      std::vector<int,_std::allocator<int>_>::vector
                (&pmap.super_vector<int,_std::allocator<int>_>,
                 (long)(pVVar8->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish -
                 (long)(pVVar8->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start >> 2,(allocator_type *)&pmap_g);
      ParallelContext::global_to_local_rank
                (pmap.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,(pVVar8->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                 (int)((ulong)((long)pmap.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)pmap.super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2));
      if (strategy == 3) {
        piVar10 = pmap.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        if (local_88 == ratio) {
          DistributionMapping::makeSFC
                    ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&pmap_g,
                     (ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar12,true,*(int *)(DAT_006e0650 + -0x38));
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar11 = 0; uVar11 != uVar1; uVar11 = uVar11 + 1) {
            piVar6 = *(int **)(pmap_g.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar11 * 6 + 2);
            for (piVar10 = *(int **)(pmap_g.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + uVar11 * 6);
                piVar10 != piVar6; piVar10 = piVar10 + 1) {
              pmap.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [*piVar10] = (int)uVar11;
            }
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)&pmap_g);
          piVar10 = pmap.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
        }
        for (; piVar10 !=
               pmap.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish; piVar10 = piVar10 + 1) {
          *piVar10 = *piVar10 / ratio;
        }
      }
      else if (strategy == 2) {
        dVar14 = ceil((double)(int)uVar1 / (double)local_88);
        piVar7 = pmap.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar13 = pmap.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar13 != piVar7; piVar13 = piVar13 + 1) {
          dVar9 = div(*piVar13,(int)dVar14);
          *piVar13 = dVar9.rem;
        }
      }
      else {
        piVar10 = pmap.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        if (strategy == 1) {
          for (; piVar10 !=
                 pmap.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish; piVar10 = piVar10 + 1) {
            *piVar10 = *piVar10 / ratio;
          }
        }
      }
      if (*(int *)(DAT_006e0650 + -0x48) == ParallelDescriptor::m_comm) {
        DistributionMapping::define
                  ((dm->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ).
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar12,&pmap);
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&pmap_g,
                   (long)pmap.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)pmap.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,&local_81);
        ParallelContext::local_to_global_rank
                  (pmap_g.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,pmap.super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                   (int)((ulong)((long)pmap.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)pmap.super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2));
        DistributionMapping::define
                  ((dm->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ).
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar12,&pmap_g);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&pmap_g);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&pmap);
    }
  }
  return;
}

Assistant:

void
MLLinOp::makeConsolidatedDMap (const Vector<BoxArray>& ba, Vector<DistributionMapping>& dm,
                               int ratio, int strategy)
{
    BL_PROFILE("MLLinOp::makeConsolidatedDMap()");

    int factor = 1;
    BL_ASSERT(!dm[0].empty());
    for (int i = 1, N=ba.size(); i < N; ++i)
    {
        if (dm[i].empty())
        {
            factor *= ratio;

            const int nprocs = ParallelContext::NProcsSub();
            const auto& pmap_fine = dm[i-1].ProcessorMap();
            Vector<int> pmap(pmap_fine.size());
            ParallelContext::global_to_local_rank(pmap.data(), pmap_fine.data(), pmap.size());
            if (strategy == 1) {
                for (auto& x: pmap) {
                    x /= ratio;
                }
            } else if (strategy == 2) {
                int nprocs_con = static_cast<int>(std::ceil(static_cast<Real>(nprocs)
                                                            / static_cast<Real>(factor)));
                for (auto& x: pmap) {
                    auto d = std::div(x,nprocs_con);
                    x = d.rem;
                }
            } else if (strategy == 3) {
                if (factor == ratio) {
                    const std::vector< std::vector<int> >& sfc = DistributionMapping::makeSFC(ba[i]);
                    for (int iproc = 0; iproc < nprocs; ++iproc) {
                        for (int ibox : sfc[iproc]) {
                            pmap[ibox] = iproc;
                        }
                    }
                }
                for (auto& x: pmap) {
                    x /= ratio;
                }
            }

            if (ParallelContext::CommunicatorSub() == ParallelDescriptor::Communicator()) {
                dm[i].define(std::move(pmap));
            } else {
                Vector<int> pmap_g(pmap.size());
                ParallelContext::local_to_global_rank(pmap_g.data(), pmap.data(), pmap.size());
                dm[i].define(std::move(pmap_g));
            }
        }
    }
}